

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_godunov_plm.cpp
# Opt level: O2

void PLM::PredictVelOnXFace
               (Box *xebox,int ncomp,Array4<double> *Imx,Array4<double> *Ipx,Array4<const_double> *q
               ,Array4<const_double> *vcc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  double dVar21;
  int iVar22;
  ulong uVar23;
  pair<bool,_bool> pVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  double *pdVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  double *pdVar37;
  long lVar38;
  double *pdVar39;
  double *pdVar40;
  uint uVar41;
  long lVar42;
  int iVar43;
  long lVar44;
  double *pdVar45;
  double *pdVar46;
  int iVar47;
  double *pdVar48;
  double *pdVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  uint uVar53;
  long lVar54;
  long lVar55;
  bool bVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar65;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar74;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  double dVar75;
  double dVar76;
  double dVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  double dVar80;
  double dVar81;
  Real qm;
  BCRec *bc;
  double *local_240;
  double *local_238;
  double local_218;
  double *local_1d8;
  double *local_160;
  double *local_158;
  double *local_150;
  
  dVar57 = dt / (geom->super_CoordSys).dx[0];
  iVar2 = (geom->domain).smallend.vect[0];
  iVar3 = (geom->domain).bigend.vect[0];
  pVar24 = anon_unknown.dwarf_416ad7::has_extdir_or_ho
                     ((h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
                      super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                      super__Vector_impl_data._M_start,ncomp,0);
  iVar4 = (xebox->smallend).vect[0];
  iVar5 = (xebox->bigend).vect[0];
  lVar42 = (long)iVar4;
  pdVar9 = q->p;
  lVar10 = q->jstride;
  lVar11 = q->kstride;
  lVar12 = q->nstride;
  uVar6 = (q->begin).x;
  lVar26 = (long)(q->begin).y;
  lVar27 = (long)(q->begin).z;
  pdVar13 = vcc->p;
  lVar14 = vcc->jstride;
  lVar15 = vcc->kstride;
  lVar54 = (long)(vcc->begin).x;
  lVar28 = (long)(vcc->begin).y;
  lVar44 = (long)(vcc->begin).z;
  if ((iVar2 < iVar4 + -1 || (~pVar24.first & 1U) != 0) &&
     (((ushort)pVar24 >> 8 & 1) == 0 || iVar5 < iVar3)) {
    lVar16 = Imx->jstride;
    lVar51 = (long)(xebox->smallend).vect[1];
    lVar50 = (long)(xebox->smallend).vect[2];
    uVar36 = (ulong)(uint)ncomp;
    if (ncomp < 1) {
      uVar36 = 0;
    }
    lVar17 = Imx->kstride;
    lVar18 = Ipx->kstride;
    lVar19 = Ipx->jstride;
    local_240 = Ipx->p + ((lVar42 + (lVar50 - (Ipx->begin).z) * lVar18 +
                                    (lVar51 - (Ipx->begin).y) * lVar19 + -1) - (long)(Ipx->begin).x)
    ;
    lVar20 = Ipx->nstride;
    local_238 = Imx->p + ((lVar42 + (lVar51 - (Imx->begin).y) * lVar16 +
                                    (lVar50 - (Imx->begin).z) * lVar17) - (long)(Imx->begin).x);
    lVar38 = Imx->nstride;
    iVar2 = (xebox->bigend).vect[1];
    iVar3 = (xebox->bigend).vect[2];
    local_1d8 = pdVar9 + ((lVar42 + (lVar50 - lVar27) * lVar11 + (lVar51 - lVar26) * lVar10 + -1) -
                         (long)(int)uVar6);
    for (uVar33 = 0; uVar33 != uVar36; uVar33 = uVar33 + 1) {
      lVar29 = uVar33 * lVar12;
      pdVar37 = local_1d8;
      pdVar39 = pdVar13 + ((lVar42 + (lVar50 - lVar44) * lVar15 + (lVar51 - lVar28) * lVar14) -
                          lVar54);
      pdVar46 = local_240;
      pdVar48 = local_238;
      for (lVar32 = lVar50; lVar32 <= iVar3; lVar32 = lVar32 + 1) {
        lVar30 = (lVar32 - lVar27) * lVar11;
        pdVar31 = pdVar39;
        pdVar40 = pdVar37;
        pdVar45 = pdVar46;
        pdVar49 = pdVar48;
        for (lVar55 = lVar51; lVar55 <= iVar2; lVar55 = lVar55 + 1) {
          if (iVar4 <= iVar5) {
            lVar34 = (lVar55 - lVar26) * lVar10;
            lVar35 = 0;
            do {
              iVar7 = (int)lVar35;
              dVar59 = pdVar40[lVar35];
              dVar81 = (pdVar40 + lVar35)[1];
              dVar77 = dVar59 - pdVar9[lVar29 + lVar30 + lVar34 + (int)((iVar4 - uVar6) + -2 + iVar7
                                                                       )];
              dVar21 = dVar81 - dVar59;
              dVar69 = 0.0;
              dVar71 = ABS(dVar77);
              dVar74 = ABS(dVar21);
              dVar66 = 0.0;
              if (0.0 <= dVar21 * dVar77) {
                dVar66 = dVar74;
                if (dVar71 <= dVar74) {
                  dVar66 = dVar71;
                }
                dVar66 = dVar66 + dVar66;
              }
              dVar61 = pdVar9[lVar29 + lVar30 + lVar34 + (int)((iVar4 - uVar6) + 2 + iVar7)] -
                       pdVar9[lVar29 + lVar30 + lVar34 + (int)((iVar4 - uVar6) + iVar7 + 1)];
              dVar65 = pdVar9[lVar29 + lVar30 + lVar34 + (int)((iVar4 - uVar6) + iVar7 + 1)] -
                       dVar81;
              if (0.0 <= dVar65 * dVar61) {
                dVar69 = ABS(dVar61);
                if (ABS(dVar65) <= ABS(dVar61)) {
                  dVar69 = ABS(dVar65);
                }
                dVar69 = dVar69 + dVar69;
              }
              dVar60 = 0.0;
              dVar67 = 0.0;
              if (0.0 <= dVar65 * dVar21) {
                dVar67 = ABS(dVar65);
                if (ABS(dVar21) <= ABS(dVar65)) {
                  dVar67 = ABS(dVar21);
                }
                dVar67 = dVar67 + dVar67;
              }
              dVar62 = pdVar9[lVar29 + lVar30 + lVar34 + (int)((iVar4 - uVar6) + -2 + iVar7)] -
                       pdVar9[lVar29 + lVar30 + lVar34 + (int)((iVar4 - uVar6) + -3 + iVar7)];
              if (0.0 <= dVar77 * dVar62) {
                dVar60 = ABS(dVar77);
                if (ABS(dVar62) <= ABS(dVar77)) {
                  dVar60 = ABS(dVar62);
                }
                dVar60 = dVar60 + dVar60;
              }
              dVar76 = 0.0;
              dVar80 = 0.0;
              if (0.0 <= dVar65 * dVar21) {
                dVar80 = ABS(dVar65);
                if (ABS(dVar21) <= ABS(dVar65)) {
                  dVar80 = ABS(dVar21);
                }
                dVar80 = dVar80 + dVar80;
              }
              if (0.0 <= dVar21 * dVar77) {
                if (dVar71 <= dVar74) {
                  dVar74 = dVar71;
                }
                dVar76 = dVar74 + dVar74;
              }
              dVar71 = (dVar62 + dVar77) * 0.5;
              dVar62 = (dVar65 + dVar21) * 0.5;
              auVar72._0_8_ = ABS(dVar71);
              auVar72._8_8_ = ABS(dVar62);
              auVar73._8_8_ = dVar80;
              auVar73._0_8_ = dVar60;
              auVar73 = minpd(auVar72,auVar73);
              dVar74 = pdVar31[lVar35];
              dVar77 = (dVar77 + dVar21) * 0.5;
              dVar21 = (dVar61 + dVar65) * 0.5;
              dVar61 = (double)((ulong)dVar77 & 0x8000000000000000 | 0x3ff0000000000000);
              auVar63._0_8_ = ABS(dVar77);
              auVar63._8_8_ = ABS(dVar21);
              auVar64._8_4_ = SUB84(dVar69,0);
              auVar64._0_8_ = dVar66;
              auVar64._12_4_ = (int)((ulong)dVar69 >> 0x20);
              auVar64 = minpd(auVar63,auVar64);
              dVar21 = ABS(dVar62 * 1.3333333333333333 +
                           (auVar64._8_8_ *
                            (double)((ulong)dVar21 & 0x8000000000000000 | 0x3ff0000000000000) +
                           auVar64._0_8_ * dVar61) * -0.16666666666666666);
              if (dVar67 <= dVar21) {
                dVar21 = dVar67;
              }
              dVar66 = (double)((ulong)dVar62 & 0x8000000000000000 | 0x3ff0000000000000);
              dVar77 = ABS(dVar77 * 1.3333333333333333 +
                           (auVar73._8_8_ * dVar66 +
                           auVar73._0_8_ *
                           (double)((ulong)dVar71 & 0x8000000000000000 | 0x3ff0000000000000)) *
                           -0.16666666666666666);
              if (dVar76 <= dVar77) {
                dVar77 = dVar76;
              }
              pdVar45[lVar35] =
                   dVar77 * dVar61 * (1.0 - pdVar31[lVar35 + -1] * dVar57) * 0.5 + dVar59;
              pdVar49[lVar35] = dVar81 + dVar66 * dVar21 * (-1.0 - dVar74 * dVar57) * 0.5;
              lVar35 = lVar35 + 1;
            } while ((iVar5 - iVar4) + 1 != (int)lVar35);
          }
          pdVar49 = pdVar49 + lVar16;
          pdVar45 = pdVar45 + lVar19;
          pdVar31 = pdVar31 + lVar14;
          pdVar40 = pdVar40 + lVar10;
        }
        pdVar48 = pdVar48 + lVar17;
        pdVar46 = pdVar46 + lVar18;
        pdVar39 = pdVar39 + lVar15;
        pdVar37 = pdVar37 + lVar11;
      }
      local_238 = local_238 + lVar38;
      local_240 = local_240 + lVar20;
      local_1d8 = local_1d8 + lVar12;
    }
  }
  else {
    lVar16 = Imx->jstride;
    lVar50 = Imx->kstride;
    lVar51 = (long)(xebox->smallend).vect[1];
    uVar36 = (ulong)(uint)ncomp;
    if (ncomp < 1) {
      uVar36 = 0;
    }
    lVar38 = (long)(xebox->smallend).vect[2];
    lVar17 = Ipx->kstride;
    lVar18 = Ipx->jstride;
    local_158 = Ipx->p + ((lVar42 + (lVar38 - (Ipx->begin).z) * lVar17 +
                                    (lVar51 - (Ipx->begin).y) * lVar18 + -1) - (long)(Ipx->begin).x)
    ;
    iVar47 = iVar2 - uVar6;
    iVar43 = iVar3 - uVar6;
    iVar25 = iVar4 - uVar6;
    local_150 = Imx->p + ((lVar42 + (lVar51 - (Imx->begin).y) * lVar16 +
                                    (lVar38 - (Imx->begin).z) * lVar50) - (long)(Imx->begin).x);
    lVar19 = Imx->nstride;
    lVar20 = Ipx->nstride;
    iVar7 = (xebox->bigend).vect[1];
    iVar8 = (xebox->bigend).vect[2];
    lVar32 = (long)(int)(~uVar6 + iVar2);
    local_160 = pdVar9 + ((lVar42 + (lVar38 - lVar27) * lVar11 + (lVar51 - lVar26) * lVar10 + -1) -
                         (long)(int)uVar6);
    for (uVar33 = 0; uVar33 != uVar36; uVar33 = uVar33 + 1) {
      lVar55 = uVar33 * lVar12;
      pdVar37 = local_150;
      pdVar39 = local_160;
      pdVar46 = pdVar13 + ((lVar42 + (lVar38 - lVar44) * lVar15 + (lVar51 - lVar28) * lVar14) -
                          lVar54);
      pdVar48 = local_158;
      for (lVar29 = lVar38; lVar29 <= iVar8; lVar29 = lVar29 + 1) {
        lVar34 = (lVar29 - lVar27) * lVar11;
        pdVar31 = pdVar37;
        pdVar40 = pdVar39;
        pdVar45 = pdVar46;
        pdVar49 = pdVar48;
        for (lVar30 = lVar51; lVar30 <= iVar7; lVar30 = lVar30 + 1) {
          if (iVar4 <= iVar5) {
            uVar41 = pbc[uVar33].bc[0] - 3;
            uVar53 = pbc[uVar33].bc[3] - 3;
            lVar35 = (lVar30 - lVar26) * lVar10;
            lVar52 = 0;
            do {
              iVar22 = (int)lVar52;
              dVar77 = pdVar9[lVar35 + lVar34 + lVar55 + (iVar22 + iVar25 + -2)];
              dVar21 = SUB168(*(undefined1 (*) [16])(pdVar40 + lVar52),0);
              dVar66 = SUB168(*(undefined1 (*) [16])(pdVar40 + lVar52),8);
              dVar71 = dVar21 - dVar77;
              dVar61 = dVar66 - dVar21;
              dVar81 = 0.0;
              dVar65 = (dVar61 + dVar71) * 0.5;
              dVar74 = ABS(dVar71);
              dVar59 = ABS(dVar61);
              dVar69 = 0.0;
              if (0.0 <= dVar61 * dVar71) {
                dVar69 = dVar59;
                if (dVar74 <= dVar59) {
                  dVar69 = dVar74;
                }
                dVar69 = dVar69 + dVar69;
              }
              dVar67 = pdVar9[lVar35 + lVar34 + lVar55 + (iVar25 + iVar22 + 1)];
              dVar62 = pdVar9[lVar35 + lVar34 + lVar55 + (iVar25 + 2 + iVar22)] - dVar67;
              dVar80 = dVar67 - dVar66;
              dVar60 = (dVar80 + dVar62) * 0.5;
              if (0.0 <= dVar80 * dVar62) {
                dVar81 = ABS(dVar62);
                if (ABS(dVar80) <= ABS(dVar62)) {
                  dVar81 = ABS(dVar80);
                }
                dVar81 = dVar81 + dVar81;
              }
              dVar62 = (dVar61 + dVar80) * 0.5;
              local_218 = 0.0;
              if (0.0 <= dVar61 * dVar80) {
                local_218 = ABS(dVar80);
                if (ABS(dVar61) <= ABS(dVar80)) {
                  local_218 = ABS(dVar61);
                }
                local_218 = local_218 + local_218;
              }
              dVar68 = (double)((ulong)dVar65 & 0x8000000000000000 | 0x3ff0000000000000);
              dVar76 = ABS(dVar65);
              if (dVar69 <= ABS(dVar65)) {
                dVar76 = dVar69;
              }
              dVar76 = dVar76 * dVar68;
              dVar69 = (double)((ulong)dVar62 & 0x8000000000000000 | 0x3ff0000000000000);
              uVar23 = (ulong)DAT_006f56c0;
              if ((uVar41 < 2) && (iVar2 - lVar42 == lVar52)) {
                local_218 = 0.0;
                if (0.0 <= (dVar61 + dVar61) * (dVar80 + dVar80)) {
                  local_218 = ABS(dVar80 + dVar80);
                  dVar81 = ABS(dVar61 + dVar61);
                  if (dVar81 <= local_218) {
                    local_218 = dVar81;
                  }
                }
                dVar60 = pdVar9[lVar35 + lVar34 + lVar55 + (iVar25 + 2 + iVar22)] * -0.1 +
                         dVar67 * 0.6666666666666666 + dVar21 * -1.0666666666666667 + dVar66 * 0.5;
                dVar81 = (double)((ulong)dVar60 & 0x8000000000000000 | 0x3ff0000000000000);
              }
              else {
                dVar1 = ABS(dVar60);
                if (dVar81 <= dVar1) {
                  dVar1 = dVar81;
                }
                dVar1 = dVar1 * (double)((ulong)dVar60 & 0x8000000000000000 | uVar23);
                dVar60 = dVar62 * 1.3333333333333333 + (dVar76 + dVar1) * -0.16666666666666666;
                dVar81 = dVar69;
                if ((uVar41 < 2) && ((iVar2 + 1) - lVar42 == lVar52)) {
                  dVar60 = pdVar9[lVar35 + lVar34 + iVar47 + lVar55];
                  dVar70 = dVar60 - pdVar9[lVar35 + lVar34 + lVar32 + lVar55];
                  dVar76 = (dVar66 - dVar60) + (dVar66 - dVar60);
                  dVar70 = dVar70 + dVar70;
                  dVar75 = 0.0;
                  if (0.0 <= dVar70 * dVar76) {
                    dVar75 = ABS(dVar76);
                    dVar70 = ABS(dVar70);
                    if (dVar70 <= dVar75) {
                      dVar75 = dVar70;
                    }
                  }
                  dVar60 = pdVar9[lVar35 + lVar34 + (iVar47 + 2) + lVar55] * -0.1 +
                           dVar66 * 0.6666666666666666 +
                           pdVar9[lVar35 + lVar34 + lVar32 + lVar55] * -1.0666666666666667 +
                           dVar60 * 0.5;
                  dVar76 = ABS(dVar60);
                  if (dVar75 <= dVar76) {
                    dVar76 = dVar75;
                  }
                  dVar76 = dVar76 * (double)((ulong)dVar60 & 0x8000000000000000 | uVar23);
                  dVar60 = dVar62 * 1.3333333333333333 + (dVar1 + dVar76) * -0.16666666666666666;
                }
              }
              dVar1 = pdVar45[lVar52];
              bVar56 = iVar3 - lVar42 != lVar52;
              if (bVar56 || 1 < uVar53) {
                if ((uVar53 < 2) && ((iVar3 + -1) - lVar42 == lVar52)) {
                  dVar60 = pdVar9[lVar35 + lVar34 + iVar43 + lVar55];
                  dVar75 = pdVar9[lVar35 + lVar34 + (iVar43 + 1) + lVar55] - dVar60;
                  dVar75 = dVar75 + dVar75;
                  dVar58 = (dVar60 - dVar66) + (dVar60 - dVar66);
                  dVar70 = 0.0;
                  if (0.0 <= dVar58 * dVar75) {
                    dVar70 = ABS(dVar75);
                    dVar58 = ABS(dVar58);
                    if (dVar58 <= dVar70) {
                      dVar70 = dVar58;
                    }
                  }
                  dVar75 = pdVar9[lVar35 + lVar34 + (iVar43 + -2) + lVar55] * 0.1 +
                           dVar66 * -0.6666666666666666 +
                           pdVar9[lVar35 + lVar34 + (iVar43 + 1) + lVar55] * 1.0666666666666667 +
                           dVar60 * -0.5;
                  dVar60 = ABS(dVar75);
                  if (dVar70 <= dVar60) {
                    dVar60 = dVar70;
                  }
                  dVar60 = dVar62 * 1.3333333333333333 +
                           (dVar76 + dVar60 * (double)((ulong)dVar75 & 0x8000000000000000 | uVar23))
                           * -0.16666666666666666;
                }
              }
              else {
                local_218 = 0.0;
                if (0.0 <= (dVar61 + dVar61) * (dVar80 + dVar80)) {
                  local_218 = ABS(dVar80 + dVar80);
                  dVar81 = ABS(dVar61 + dVar61);
                  if (dVar81 <= local_218) {
                    local_218 = dVar81;
                  }
                }
                dVar60 = dVar77 * 0.1 +
                         dVar21 * -0.6666666666666666 + dVar67 * 1.0666666666666667 + dVar66 * -0.5;
                dVar81 = (double)((ulong)dVar60 & 0x8000000000000000 | 0x3ff0000000000000);
              }
              dVar58 = dVar77 - pdVar9[lVar35 + lVar34 + lVar55 + (int)((iVar4 - uVar6) + -3 +
                                                                       iVar22)];
              dVar76 = (dVar71 + dVar58) * 0.5;
              dVar75 = 0.0;
              dVar70 = 0.0;
              if (0.0 <= dVar71 * dVar58) {
                dVar70 = ABS(dVar71);
                if (ABS(dVar58) <= ABS(dVar71)) {
                  dVar70 = ABS(dVar58);
                }
                dVar70 = dVar70 + dVar70;
              }
              if (0.0 <= dVar61 * dVar80) {
                dVar75 = ABS(dVar80);
                if (ABS(dVar61) <= ABS(dVar80)) {
                  dVar75 = ABS(dVar61);
                }
                dVar75 = dVar75 + dVar75;
              }
              dVar58 = 0.0;
              if (0.0 <= dVar61 * dVar71) {
                if (dVar74 <= dVar59) {
                  dVar59 = dVar74;
                }
                dVar58 = dVar59 + dVar59;
              }
              dVar59 = ABS(dVar76);
              if (dVar70 <= dVar59) {
                dVar59 = dVar70;
              }
              dVar59 = dVar59 * (double)((ulong)dVar76 & 0x8000000000000000 | uVar23);
              if ((uVar41 < 2) && ((iVar2 - iVar4) + 1 == iVar22)) {
                dVar58 = 0.0;
                if (0.0 <= (dVar61 + dVar61) * (dVar71 + dVar71)) {
                  dVar69 = ABS(dVar71 + dVar71);
                  dVar58 = ABS(dVar61 + dVar61);
                  if (dVar69 <= dVar58) {
                    dVar58 = dVar69;
                  }
                }
                dVar62 = dVar67 * -0.1 +
                         dVar66 * 0.6666666666666666 + dVar77 * -1.0666666666666667 + dVar21 * 0.5;
                dVar68 = (double)((ulong)dVar62 & 0x8000000000000000 | 0x3ff0000000000000);
              }
              else {
                dVar74 = ABS(dVar62);
                if (dVar75 <= ABS(dVar62)) {
                  dVar74 = dVar75;
                }
                dVar62 = dVar65 * 1.3333333333333333 +
                         (dVar59 + dVar69 * dVar74) * -0.16666666666666666;
                if ((uVar41 < 2) && ((iVar2 - iVar4) + 2 == iVar22)) {
                  dVar59 = pdVar9[lVar35 + lVar34 + iVar47 + lVar55];
                  dVar76 = dVar59 - pdVar9[lVar35 + lVar34 + lVar32 + lVar55];
                  dVar62 = (dVar21 - dVar59) + (dVar21 - dVar59);
                  dVar76 = dVar76 + dVar76;
                  uVar78 = 0;
                  uVar79 = 0;
                  if (0.0 <= dVar76 * dVar62) {
                    dVar62 = ABS(dVar62);
                    dVar76 = ABS(dVar76);
                    if (dVar76 <= dVar62) {
                      dVar62 = dVar76;
                    }
                    uVar78 = SUB84(dVar62,0);
                    uVar79 = (undefined4)((ulong)dVar62 >> 0x20);
                  }
                  dVar62 = pdVar9[lVar35 + lVar34 + (iVar47 + 2) + lVar55] * -0.1 +
                           dVar21 * 0.6666666666666666 +
                           pdVar9[lVar35 + lVar34 + lVar32 + lVar55] * -1.0666666666666667 +
                           dVar59 * 0.5;
                  dVar59 = ABS(dVar62);
                  if ((double)CONCAT44(uVar79,uVar78) <= dVar59) {
                    dVar59 = (double)CONCAT44(uVar79,uVar78);
                  }
                  dVar59 = dVar59 * (double)((ulong)dVar62 & 0x8000000000000000 | uVar23);
                  dVar62 = dVar65 * 1.3333333333333333 +
                           (dVar69 * dVar74 + dVar59) * -0.16666666666666666;
                }
              }
              if ((uVar53 < 2) && ((iVar3 - iVar4) + 1 == iVar22)) {
                dVar58 = 0.0;
                if (0.0 <= (dVar61 + dVar61) * (dVar71 + dVar71)) {
                  dVar59 = ABS(dVar71 + dVar71);
                  dVar58 = ABS(dVar61 + dVar61);
                  if (dVar59 <= dVar58) {
                    dVar58 = dVar59;
                  }
                }
                dVar62 = pdVar9[lVar35 + lVar34 + lVar55 + (int)((iVar4 - uVar6) + -3 + iVar22)] *
                         0.1 + dVar77 * -0.6666666666666666 +
                               dVar66 * 1.0666666666666667 + dVar21 * -0.5;
                dVar68 = (double)((ulong)dVar62 & 0x8000000000000000 | 0x3ff0000000000000);
              }
              else if (!bVar56 && 1 >= uVar53) {
                dVar74 = dVar66 - pdVar9[lVar35 + lVar34 + lVar55 + (int)(~uVar6 + iVar3)];
                dVar74 = dVar74 + dVar74;
                dVar69 = 0.0;
                if (0.0 <= dVar74 * (dVar80 + dVar80)) {
                  dVar69 = ABS(dVar80 + dVar80);
                  dVar74 = ABS(dVar74);
                  if (dVar74 <= dVar69) {
                    dVar69 = dVar74;
                  }
                }
                dVar77 = dVar77 * 0.1 +
                         pdVar9[lVar35 + lVar34 + lVar55 + (int)(~uVar6 + iVar3)] *
                         -0.6666666666666666 + dVar67 * 1.0666666666666667 + dVar66 * -0.5;
                dVar74 = ABS(dVar77);
                if (dVar69 <= dVar74) {
                  dVar74 = dVar69;
                }
                dVar62 = dVar65 * 1.3333333333333333 +
                         (dVar59 + dVar74 * (double)((ulong)dVar77 & 0x8000000000000000 | uVar23)) *
                         -0.16666666666666666;
              }
              dVar77 = ABS(dVar60);
              if (local_218 <= ABS(dVar60)) {
                dVar77 = local_218;
              }
              dVar59 = ABS(dVar62);
              if (dVar58 <= ABS(dVar62)) {
                dVar59 = dVar58;
              }
              pdVar49[lVar52] =
                   dVar59 * dVar68 * (1.0 - pdVar45[lVar52 + -1] * dVar57) * 0.5 + dVar21;
              pdVar31[lVar52] = dVar81 * dVar77 * (-1.0 - dVar1 * dVar57) * 0.5 + dVar66;
              lVar52 = lVar52 + 1;
            } while ((iVar5 - iVar4) + 1 != (int)lVar52);
          }
          pdVar31 = pdVar31 + lVar16;
          pdVar49 = pdVar49 + lVar18;
          pdVar45 = pdVar45 + lVar14;
          pdVar40 = pdVar40 + lVar10;
        }
        pdVar37 = pdVar37 + lVar50;
        pdVar48 = pdVar48 + lVar17;
        pdVar46 = pdVar46 + lVar15;
        pdVar39 = pdVar39 + lVar11;
      }
      local_150 = local_150 + lVar19;
      local_158 = local_158 + lVar20;
      local_160 = local_160 + lVar12;
    }
  }
  return;
}

Assistant:

void
PLM::PredictVelOnXFace ( Box const& xebox, int ncomp,
                         Array4<Real> const& Imx, Array4<Real> const& Ipx,
                         Array4<Real const> const& q,
                         Array4<Real const> const& vcc,
                         const Geometry& geom,
                         Real dt,
                         Vector<BCRec> const& h_bcrec,
                         BCRec const* pbc)
{
    const Real dx = geom.CellSize(0);
    const Real dtdx = dt/dx;

    const Box& domain_box = geom.Domain();
    const int domain_ilo = domain_box.smallEnd(0);
    const int domain_ihi = domain_box.bigEnd(0);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi = has_extdir_or_ho(h_bcrec.data(), ncomp, static_cast<int>(Direction::x));
    bool has_extdir_or_ho_lo = extdir_lohi.first;
    bool has_extdir_or_ho_hi = extdir_lohi.second;

    if ((has_extdir_or_ho_lo && domain_ilo >= xebox.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi && domain_ihi <= xebox.bigEnd(0)))
    {
        amrex::ParallelFor(xebox, ncomp, [q,vcc,domain_ilo,domain_ihi,Imx,Ipx,dtdx,pbc]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            const auto& bc = pbc[n];
            bool extdir_or_ho_ilo = (bc.lo(0) == BCType::ext_dir) ||
                                    (bc.lo(0) == BCType::hoextrap);
            bool extdir_or_ho_ihi = (bc.hi(0) == BCType::ext_dir) ||
                                    (bc.hi(0) == BCType::hoextrap);

            int order = 4;

            Real upls = q(i  ,j,k,n) + 0.5 * (-1.0 - vcc(i  ,j,k,0) * dtdx) *
                amrex_calc_xslope_extdir(i  ,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);
            Real umns = q(i-1,j,k,n) + 0.5 * ( 1.0 - vcc(i-1,j,k,0) * dtdx) *
                amrex_calc_xslope_extdir(i-1,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);

            Ipx(i-1,j,k,n) = umns;
            Imx(i  ,j,k,n) = upls;
        });
    }
    else
    {
        amrex::ParallelFor(xebox, ncomp, [q,vcc,Ipx,Imx,dtdx]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            int order = 4;

            Real upls = q(i  ,j,k,n) + 0.5 * (-1.0 - vcc(i  ,j,k,0) * dtdx) *
                amrex_calc_xslope(i  ,j,k,n,order,q);
            Real umns = q(i-1,j,k,n) + 0.5 * ( 1.0 - vcc(i-1,j,k,0) * dtdx) *
                amrex_calc_xslope(i-1,j,k,n,order,q);

            Ipx(i-1,j,k,n) = umns;
            Imx(i  ,j,k,n) = upls;
        });
    }
}